

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

void __thiscall Tokens::Inverter(Tokens *this)

{
  pointer piVar1;
  vector<int,_std::allocator<int>_> aux;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&local_28,&this->Token);
  piVar1 = (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->Token).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  for (; local_28._M_impl.super__Vector_impl_data._M_start !=
         local_28._M_impl.super__Vector_impl_data._M_finish;
      local_28._M_impl.super__Vector_impl_data._M_finish =
           local_28._M_impl.super__Vector_impl_data._M_finish + -1) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->Token,local_28._M_impl.super__Vector_impl_data._M_finish + -1);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void Tokens::Inverter (){
  vector<int>aux;
  aux = Token;
  Token.clear();
  while (!aux.empty()){
    Token.push_back(aux.back());
    aux.pop_back();
  }
  aux.clear();
}